

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O3

void delete_ast_translation_unit(AST_Translation_Unit *translation_unit)

{
  AST *ast;
  
  if ((translation_unit->components).size != 0) {
    do {
      ast = (AST *)Queue_Pop(&translation_unit->components);
      delete_ast(ast);
    } while ((translation_unit->components).size != 0);
  }
  if (translation_unit->file_scope != (Scope *)0x0) {
    delete_scope(translation_unit->file_scope);
  }
  delete_linkage(translation_unit->internal_linkage);
  free(translation_unit);
  return;
}

Assistant:

void delete_ast_translation_unit(struct AST_Translation_Unit *translation_unit)
{
	while(translation_unit->components.size>0)
		delete_ast((struct AST*)Queue_Pop(&translation_unit->components));
	if(translation_unit->file_scope!=NULL)
		delete_scope(translation_unit->file_scope);
	delete_linkage(translation_unit->internal_linkage);
	free(translation_unit);
}